

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isStrength0(TokenKind kind)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = CONCAT22(in_register_0000003a,kind) - 0x11f;
  if ((((0x2c < uVar1) || ((0x100000000011U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
      (CONCAT22(in_register_0000003a,kind) != 0xb4)) &&
     (CONCAT22(in_register_0000003a,kind) != 0xf2)) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isStrength0(TokenKind kind) {
    switch (kind) {
        case TokenKind::Strong0Keyword:
        case TokenKind::Weak0Keyword:
        case TokenKind::Pull0Keyword:
        case TokenKind::Supply0Keyword:
        case TokenKind::HighZ0Keyword:
            return true;
        default:
            return false;
    }
}